

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountOverJoin.cpp
# Opt level: O1

void __thiscall
CountOverJoin::CountOverJoin(CountOverJoin *this,string *pathToFiles,shared_ptr<Launcher> *launcher)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_MachineLearningModel)._vptr_MachineLearningModel =
       (_func_int **)&PTR__CountOverJoin_00144be0;
  (this->_pathToFiles)._M_dataplus._M_p = (pointer)&(this->_pathToFiles).field_2;
  pcVar1 = (pathToFiles->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_pathToFiles,pcVar1,pcVar1 + pathToFiles->_M_string_length);
  (this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->_joinEngine).super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_joinEngine).super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Launcher::getDTree((launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this->numberOfValues = 0;
  return;
}

Assistant:

CountOverJoin::CountOverJoin(
    const std::string& pathToFiles,std::shared_ptr<Launcher> launcher) : 
    _pathToFiles(pathToFiles), _launcher(launcher), _dTree(launcher->getDTree())
{
}